

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GtestReportTextTest.cpp
# Opt level: O1

void __thiscall GtestReportTextTest::GtestReportTextTest(GtestReportTextTest *this)

{
  GtestReportText *pGVar1;
  tuple<oout::SuiteResult_*,_std::default_delete<oout::SuiteResult>_> this_00;
  shared_ptr<const_oout::Result> local_1e0;
  _Head_base<0UL,_oout::NamedResult_*,_false> local_1d0;
  _Head_base<0UL,_oout::GtestReportText_*,_false> local_1c8;
  _Head_base<0UL,_oout::GtestReportText_*,_false> local_1c0;
  _Head_base<0UL,_oout::GtestReportText_*,_false> local_1b8;
  _Head_base<0UL,_oout::GtestReportText_*,_false> local_1b0;
  _Head_base<0UL,_oout::GtestReportText_*,_false> local_1a8;
  _Head_base<0UL,_oout::GtestReportText_*,_false> local_1a0;
  _Head_base<0UL,_const_oout::Test_*,_false> local_198;
  __uniq_ptr_impl<oout::SuiteResult,_std::default_delete<oout::SuiteResult>_> local_190;
  TestResult *local_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_180;
  TestResult *local_178;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_170;
  NamedResult *local_168;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_160;
  NamedResult *local_158;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_150;
  NamedResult *local_148;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_140;
  shared_ptr<oout::SuccessResult> local_138;
  shared_ptr<oout::TestResult> local_128;
  shared_ptr<oout::SuccessResult> local_118;
  shared_ptr<oout::TestResult> local_108;
  shared_ptr<oout::SuccessResult> local_f8;
  shared_ptr<oout::SuccessResult> local_e8;
  shared_ptr<oout::ContainTest> local_d8;
  shared_ptr<oout::FailureResult> local_c8;
  shared_ptr<oout::TestResult> local_b8;
  shared_ptr<oout::ContainTest> local_a8;
  shared_ptr<oout::SuccessResult> local_98;
  shared_ptr<oout::TestResult> local_88;
  shared_ptr<oout::ContainTest> local_78;
  shared_ptr<oout::TestResult> local_68;
  shared_ptr<oout::ContainTest> local_58;
  ContainTest *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  shared_ptr<oout::ContainTest> local_38;
  shared_ptr<oout::FailureResult> local_28;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__GtestReportTextTest_00198d10;
  local_28.super___shared_ptr<oout::FailureResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::FailureResult,std::allocator<oout::FailureResult>>
            (&local_28.super___shared_ptr<oout::FailureResult,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(FailureResult **)&local_28,(allocator<oout::FailureResult> *)&local_1e0);
  local_68.super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::TestResult,std::allocator<oout::TestResult>,std::shared_ptr<oout::FailureResult>>
            (&local_68.super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (TestResult **)&local_68,(allocator<oout::TestResult> *)&local_1e0,&local_28);
  local_148 = (NamedResult *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::NamedResult,std::allocator<oout::NamedResult>,char_const(&)[9],std::shared_ptr<oout::TestResult>>
            (&_Stack_140,&local_148,(allocator<oout::NamedResult> *)&local_1e0,
             (char (*) [9])0x17dbb4,&local_68);
  pGVar1 = (GtestReportText *)operator_new(0x18);
  local_1e0.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_148->super_Result;
  local_1e0.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_140._M_pi;
  local_148 = (NamedResult *)0x0;
  _Stack_140._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  oout::GtestReportText::GtestReportText(pGVar1,&local_1e0);
  local_1a0._M_head_impl = pGVar1;
  if (local_1e0.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1e0.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_58.super___shared_ptr<oout::ContainTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::ContainTest,std::allocator<oout::ContainTest>,std::unique_ptr<oout::GtestReportText,std::default_delete<oout::GtestReportText>>,char_const(&)[22]>
            (&local_58.super___shared_ptr<oout::ContainTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,(ContainTest **)&local_58,(allocator<oout::ContainTest> *)&local_1e0,
             (unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_> *)
             &local_1a0,(char (*) [22])"[ RUN      ] run test");
  local_98.super___shared_ptr<oout::SuccessResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::SuccessResult,std::allocator<oout::SuccessResult>>
            (&local_98.super___shared_ptr<oout::SuccessResult,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(SuccessResult **)&local_98,(allocator<oout::SuccessResult> *)&local_1e0);
  local_88.super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::TestResult,std::allocator<oout::TestResult>,std::shared_ptr<oout::SuccessResult>>
            (&local_88.super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (TestResult **)&local_88,(allocator<oout::TestResult> *)&local_1e0,&local_98);
  local_158 = (NamedResult *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::NamedResult,std::allocator<oout::NamedResult>,char_const(&)[8],std::shared_ptr<oout::TestResult>>
            (&_Stack_150,&local_158,(allocator<oout::NamedResult> *)&local_1e0,
             (char (*) [8])0x17dbca,&local_88);
  pGVar1 = (GtestReportText *)operator_new(0x18);
  local_1e0.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_158->super_Result;
  local_1e0.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_150._M_pi;
  local_158 = (NamedResult *)0x0;
  _Stack_150._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  oout::GtestReportText::GtestReportText(pGVar1,&local_1e0);
  local_1a8._M_head_impl = pGVar1;
  if (local_1e0.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1e0.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_78.super___shared_ptr<oout::ContainTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::ContainTest,std::allocator<oout::ContainTest>,std::unique_ptr<oout::GtestReportText,std::default_delete<oout::GtestReportText>>,char_const(&)[21]>
            (&local_78.super___shared_ptr<oout::ContainTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,(ContainTest **)&local_78,(allocator<oout::ContainTest> *)&local_1e0,
             (unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_> *)
             &local_1a8,(char (*) [21])"[       OK ] ok test");
  local_c8.super___shared_ptr<oout::FailureResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::FailureResult,std::allocator<oout::FailureResult>>
            (&local_c8.super___shared_ptr<oout::FailureResult,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(FailureResult **)&local_c8,(allocator<oout::FailureResult> *)&local_1e0);
  local_b8.super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::TestResult,std::allocator<oout::TestResult>,std::shared_ptr<oout::FailureResult>>
            (&local_b8.super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (TestResult **)&local_b8,(allocator<oout::TestResult> *)&local_1e0,&local_c8);
  local_168 = (NamedResult *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::NamedResult,std::allocator<oout::NamedResult>,char_const(&)[10],std::shared_ptr<oout::TestResult>>
            (&_Stack_160,&local_168,(allocator<oout::NamedResult> *)&local_1e0,
             (char (*) [10])0x17dbdf,&local_b8);
  pGVar1 = (GtestReportText *)operator_new(0x18);
  local_1e0.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_168->super_Result;
  local_1e0.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_160._M_pi;
  local_168 = (NamedResult *)0x0;
  _Stack_160._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  oout::GtestReportText::GtestReportText(pGVar1,&local_1e0);
  local_1b0._M_head_impl = pGVar1;
  if (local_1e0.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1e0.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_a8.super___shared_ptr<oout::ContainTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::ContainTest,std::allocator<oout::ContainTest>,std::unique_ptr<oout::GtestReportText,std::default_delete<oout::GtestReportText>>,char_const(&)[23]>
            (&local_a8.super___shared_ptr<oout::ContainTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,(ContainTest **)&local_a8,(allocator<oout::ContainTest> *)&local_1e0,
             (unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_> *)
             &local_1b0,(char (*) [23])"[  FAILED  ] fail test");
  local_e8.super___shared_ptr<oout::SuccessResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::SuccessResult,std::allocator<oout::SuccessResult>>
            (&local_e8.super___shared_ptr<oout::SuccessResult,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(SuccessResult **)&local_e8,(allocator<oout::SuccessResult> *)&local_1e0);
  local_178 = (TestResult *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::TestResult,std::allocator<oout::TestResult>,std::shared_ptr<oout::SuccessResult>>
            (&_Stack_170,&local_178,(allocator<oout::TestResult> *)&local_1e0,&local_e8);
  pGVar1 = (GtestReportText *)operator_new(0x18);
  local_1e0.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_178->super_Result;
  local_1e0.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_170._M_pi;
  local_178 = (TestResult *)0x0;
  _Stack_170._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  oout::GtestReportText::GtestReportText(pGVar1,&local_1e0);
  local_1b8._M_head_impl = pGVar1;
  if (local_1e0.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1e0.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_d8.super___shared_ptr<oout::ContainTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::ContainTest,std::allocator<oout::ContainTest>,std::unique_ptr<oout::GtestReportText,std::default_delete<oout::GtestReportText>>,char_const(&)[21]>
            (&local_d8.super___shared_ptr<oout::ContainTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,(ContainTest **)&local_d8,(allocator<oout::ContainTest> *)&local_1e0,
             (unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_> *)
             &local_1b8,(char (*) [21])"[==========] Running");
  local_f8.super___shared_ptr<oout::SuccessResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::SuccessResult,std::allocator<oout::SuccessResult>>
            (&local_f8.super___shared_ptr<oout::SuccessResult,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(SuccessResult **)&local_f8,(allocator<oout::SuccessResult> *)&local_1e0);
  local_188 = (TestResult *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::TestResult,std::allocator<oout::TestResult>,std::shared_ptr<oout::SuccessResult>>
            (&_Stack_180,&local_188,(allocator<oout::TestResult> *)&local_1e0,&local_f8);
  pGVar1 = (GtestReportText *)operator_new(0x18);
  local_1e0.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_188->super_Result;
  local_1e0.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_180._M_pi;
  local_188 = (TestResult *)0x0;
  _Stack_180._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  oout::GtestReportText::GtestReportText(pGVar1,&local_1e0);
  local_1c0._M_head_impl = pGVar1;
  if (local_1e0.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1e0.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_38.super___shared_ptr<oout::ContainTest,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::ContainTest,std::allocator<oout::ContainTest>,std::unique_ptr<oout::GtestReportText,std::default_delete<oout::GtestReportText>>,char_const(&)[25]>
            (&local_38.super___shared_ptr<oout::ContainTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,(ContainTest **)&local_38,(allocator<oout::ContainTest> *)&local_1e0,
             (unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_> *)
             &local_1c0,(char (*) [25])"[==========] 1 tests ran");
  local_118.super___shared_ptr<oout::SuccessResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::SuccessResult,std::allocator<oout::SuccessResult>>
            (&local_118.super___shared_ptr<oout::SuccessResult,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(SuccessResult **)&local_118,(allocator<oout::SuccessResult> *)&local_1e0)
  ;
  local_108.super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::TestResult,std::allocator<oout::TestResult>,std::shared_ptr<oout::SuccessResult>>
            (&local_108.super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,(TestResult **)&local_108,(allocator<oout::TestResult> *)&local_1e0,&local_118);
  local_138.super___shared_ptr<oout::SuccessResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::SuccessResult,std::allocator<oout::SuccessResult>>
            (&local_138.super___shared_ptr<oout::SuccessResult,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(SuccessResult **)&local_138,(allocator<oout::SuccessResult> *)&local_1e0)
  ;
  local_128.super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::TestResult,std::allocator<oout::TestResult>,std::shared_ptr<oout::SuccessResult>>
            (&local_128.super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,(TestResult **)&local_128,(allocator<oout::TestResult> *)&local_1e0,&local_138);
  this_00.super__Tuple_impl<0UL,_oout::SuiteResult_*,_std::default_delete<oout::SuiteResult>_>.
  super__Head_base<0UL,_oout::SuiteResult_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_oout::SuiteResult_*,_std::default_delete<oout::SuiteResult>_>)
       operator_new(0x20);
  oout::SuiteResult::SuiteResult<oout::TestResult,oout::TestResult>
            ((SuiteResult *)
             this_00.
             super__Tuple_impl<0UL,_oout::SuiteResult_*,_std::default_delete<oout::SuiteResult>_>.
             super__Head_base<0UL,_oout::SuiteResult_*,_false>._M_head_impl,&local_108,&local_128);
  local_190._M_t.
  super__Tuple_impl<0UL,_oout::SuiteResult_*,_std::default_delete<oout::SuiteResult>_>.
  super__Head_base<0UL,_oout::SuiteResult_*,_false>._M_head_impl =
       (tuple<oout::SuiteResult_*,_std::default_delete<oout::SuiteResult>_>)
       (tuple<oout::SuiteResult_*,_std::default_delete<oout::SuiteResult>_>)
       this_00.super__Tuple_impl<0UL,_oout::SuiteResult_*,_std::default_delete<oout::SuiteResult>_>.
       super__Head_base<0UL,_oout::SuiteResult_*,_false>._M_head_impl;
  std::
  make_unique<oout::NamedResult,char_const(&)[6],std::unique_ptr<oout::SuiteResult,std::default_delete<oout::SuiteResult>>>
            ((char (*) [6])&local_1d0,
             (unique_ptr<oout::SuiteResult,_std::default_delete<oout::SuiteResult>_> *)0x17dc30);
  pGVar1 = (GtestReportText *)operator_new(0x18);
  std::__shared_ptr<oout::Result_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<oout::NamedResult,std::default_delete<oout::NamedResult>,void>
            ((__shared_ptr<oout::Result_const,(__gnu_cxx::_Lock_policy)2> *)&local_1e0,
             (unique_ptr<oout::NamedResult,_std::default_delete<oout::NamedResult>_> *)&local_1d0);
  oout::GtestReportText::GtestReportText(pGVar1,&local_1e0);
  local_1c8._M_head_impl = pGVar1;
  if (local_1e0.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1e0.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_48 = (ContainTest *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::ContainTest,std::allocator<oout::ContainTest>,std::unique_ptr<oout::GtestReportText,std::default_delete<oout::GtestReportText>>,char_const(&)[31]>
            (&local_40,&local_48,(allocator<oout::ContainTest> *)&local_1e0,
             (unique_ptr<oout::GtestReportText,_std::default_delete<oout::GtestReportText>_> *)
             &local_1c8,(char (*) [31])"[----------] 2 test from SUITE");
  std::
  make_unique<oout::NamedTest,char_const(&)[20],std::shared_ptr<oout::ContainTest>,std::shared_ptr<oout::ContainTest>,std::shared_ptr<oout::ContainTest>,std::shared_ptr<oout::ContainTest>,std::shared_ptr<oout::ContainTest>,std::shared_ptr<oout::ContainTest>>
            ((char (*) [20])&local_198,(shared_ptr<oout::ContainTest> *)"GtestReportTextTest",
             &local_58,&local_78,&local_a8,&local_d8,&local_38);
  (this->tests)._M_t.super___uniq_ptr_impl<const_oout::Test,_std::default_delete<const_oout::Test>_>
  ._M_t.super__Tuple_impl<0UL,_const_oout::Test_*,_std::default_delete<const_oout::Test>_>.
  super__Head_base<0UL,_const_oout::Test_*,_false>._M_head_impl = local_198._M_head_impl;
  local_198._M_head_impl = (Test *)0x0;
  if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
  }
  if (local_1c8._M_head_impl != (GtestReportText *)0x0) {
    std::default_delete<oout::GtestReportText>::operator()
              ((default_delete<oout::GtestReportText> *)&local_1c8,local_1c8._M_head_impl);
  }
  local_1c8._M_head_impl = (GtestReportText *)0x0;
  if (local_1d0._M_head_impl != (NamedResult *)0x0) {
    std::default_delete<oout::NamedResult>::operator()
              ((default_delete<oout::NamedResult> *)&local_1d0,local_1d0._M_head_impl);
  }
  local_1d0._M_head_impl = (NamedResult *)0x0;
  std::unique_ptr<oout::SuiteResult,_std::default_delete<oout::SuiteResult>_>::~unique_ptr
            ((unique_ptr<oout::SuiteResult,_std::default_delete<oout::SuiteResult>_> *)&local_190);
  if (local_128.super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_128.super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_138.super___shared_ptr<oout::SuccessResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_138.super___shared_ptr<oout::SuccessResult,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_108.super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_108.super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_118.super___shared_ptr<oout::SuccessResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_118.super___shared_ptr<oout::SuccessResult,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_38.super___shared_ptr<oout::ContainTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<oout::ContainTest,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_1c0._M_head_impl != (GtestReportText *)0x0) {
    std::default_delete<oout::GtestReportText>::operator()
              ((default_delete<oout::GtestReportText> *)&local_1c0,local_1c0._M_head_impl);
  }
  local_1c0._M_head_impl = (GtestReportText *)0x0;
  if (_Stack_180._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_180._M_pi);
  }
  if (local_f8.super___shared_ptr<oout::SuccessResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f8.super___shared_ptr<oout::SuccessResult,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d8.super___shared_ptr<oout::ContainTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.super___shared_ptr<oout::ContainTest,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_1b8._M_head_impl != (GtestReportText *)0x0) {
    std::default_delete<oout::GtestReportText>::operator()
              ((default_delete<oout::GtestReportText> *)&local_1b8,local_1b8._M_head_impl);
  }
  local_1b8._M_head_impl = (GtestReportText *)0x0;
  if (_Stack_170._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_170._M_pi);
  }
  if (local_e8.super___shared_ptr<oout::SuccessResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e8.super___shared_ptr<oout::SuccessResult,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_a8.super___shared_ptr<oout::ContainTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<oout::ContainTest,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_1b0._M_head_impl != (GtestReportText *)0x0) {
    std::default_delete<oout::GtestReportText>::operator()
              ((default_delete<oout::GtestReportText> *)&local_1b0,local_1b0._M_head_impl);
  }
  local_1b0._M_head_impl = (GtestReportText *)0x0;
  if (_Stack_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_160._M_pi);
  }
  if (local_b8.super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (local_c8.super___shared_ptr<oout::FailureResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c8.super___shared_ptr<oout::FailureResult,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_78.super___shared_ptr<oout::ContainTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<oout::ContainTest,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_1a8._M_head_impl != (GtestReportText *)0x0) {
    std::default_delete<oout::GtestReportText>::operator()
              ((default_delete<oout::GtestReportText> *)&local_1a8,local_1a8._M_head_impl);
  }
  local_1a8._M_head_impl = (GtestReportText *)0x0;
  if (_Stack_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_150._M_pi);
  }
  if (local_88.super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (local_98.super___shared_ptr<oout::SuccessResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<oout::SuccessResult,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_58.super___shared_ptr<oout::ContainTest,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<oout::ContainTest,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_1a0._M_head_impl != (GtestReportText *)0x0) {
    std::default_delete<oout::GtestReportText>::operator()
              ((default_delete<oout::GtestReportText> *)&local_1a0,local_1a0._M_head_impl);
  }
  local_1a0._M_head_impl = (GtestReportText *)0x0;
  if (_Stack_140._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_140._M_pi);
  }
  if (local_68.super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<oout::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (local_28.super___shared_ptr<oout::FailureResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<oout::FailureResult,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

GtestReportTextTest::GtestReportTextTest()
: tests(
	make_unique<NamedTest>(
		"GtestReportTextTest",
		make_shared<ContainTest>(
			make_unique<GtestReportText>(
				make_shared<NamedResult>(
					"run test",
					make_shared<TestResult>(make_shared<FailureResult>())
				)
			),
			"[ RUN      ] run test"
		),
		make_shared<ContainTest>(
			make_unique<GtestReportText>(
				make_shared<NamedResult>(
					"ok test",
					make_shared<TestResult>(make_shared<SuccessResult>())
				)
			),
			"[       OK ] ok test"
		),
		make_shared<ContainTest>(
			make_unique<GtestReportText>(
				make_shared<NamedResult>(
					"fail test",
					make_shared<TestResult>(make_shared<FailureResult>())
				)
			),
			"[  FAILED  ] fail test"
		),
		make_shared<ContainTest>(
			make_unique<GtestReportText>(
				make_shared<TestResult>(make_shared<SuccessResult>())
			),
			"[==========] Running"
		),
		make_shared<ContainTest>(
			make_unique<GtestReportText>(
				make_shared<TestResult>(make_shared<SuccessResult>())
			),
			"[==========] 1 tests ran"
		),
		make_shared<ContainTest>(
			make_unique<GtestReportText>(
				make_unique<NamedResult>(
					"SUITE",
					make_unique<SuiteResult>(
						make_shared<TestResult>(
							make_shared<SuccessResult>()
						),
						make_shared<TestResult>(
							make_shared<SuccessResult>()
						)
					)
				)
			),
			"[----------] 2 test from SUITE"
		)
	)
)
{
}